

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::Compiler::get_extended_decoration
          (Compiler *this,uint32_t id,ExtendedDecorations decoration)

{
  Meta *pMVar1;
  _Node_iterator_base<unsigned_int,_false> _Var2;
  uint32_t *puVar3;
  ExtendedDecorations local_1c;
  
  pMVar1 = ParsedIR::find_meta(&this->ir,(ID)id);
  if (pMVar1 == (Meta *)0x0) {
    return 0;
  }
  if (decoration < 0x40) {
    _Var2._M_cur = (__node_type *)
                   ((pMVar1->decoration).extended.flags.lower >> ((ulong)decoration & 0x3f) & 1);
  }
  else {
    local_1c = decoration;
    _Var2._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(pMVar1->decoration).extended.flags.higher._M_h,&local_1c);
  }
  if (_Var2._M_cur == (__node_type *)0x0) {
    if (5 < decoration - SPIRVCrossDecorationInterfaceMemberIndex) {
      return 0;
    }
    puVar3 = (uint32_t *)
             (&DAT_0037a5bc + (ulong)(decoration - SPIRVCrossDecorationInterfaceMemberIndex) * 4);
  }
  else {
    puVar3 = (pMVar1->decoration).extended.values + decoration;
  }
  return *puVar3;
}

Assistant:

uint32_t Compiler::get_extended_decoration(uint32_t id, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(id);
	if (!m)
		return 0;

	auto &dec = m->decoration;

	if (!dec.extended.flags.get(decoration))
		return get_default_extended_decoration(decoration);

	return dec.extended.values[decoration];
}